

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinflate.c
# Opt level: O2

int tinf_decode_symbol(tinf_data *d,tinf_tree *t)

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = 0;
  lVar4 = 1;
  iVar5 = 0;
  while( true ) {
    uVar3 = tinf_getbits(d,1);
    if (lVar4 == 0x10) {
      __assert_fail("len <= 15",
                    "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/src/tinflate.c"
                    ,0xf7,"int tinf_decode_symbol(struct tinf_data *, const struct tinf_tree *)");
    }
    iVar1 = uVar3 + iVar5 * 2;
    uVar2 = t->counts[lVar4];
    iVar5 = iVar1 - (uint)uVar2;
    if (iVar1 < (int)(uint)uVar2) break;
    iVar6 = iVar6 + (uint)uVar2;
    lVar4 = lVar4 + 1;
  }
  if ((uint)(iVar1 + iVar6) < 0x120) {
    return (int)t->symbols[(uint)(iVar1 + iVar6)];
  }
  __assert_fail("base + offs >= 0 && base + offs < 288",
                "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/src/tinflate.c",
                0x101,"int tinf_decode_symbol(struct tinf_data *, const struct tinf_tree *)");
}

Assistant:

static int tinf_decode_symbol(struct tinf_data *d, const struct tinf_tree *t)
{
	int base = 0, offs = 0;
	int len;

	/*
	 * Get more bits while code index is above number of codes
	 *
	 * Rather than the actual code, we are computing the position of the
	 * code in the sorted order of codes, which is the index of the
	 * corresponding symbol.
	 *
	 * Conceptually, for each code length (level in the tree), there are
	 * counts[len] leaves on the left and internal nodes on the right.
	 * The index we have decoded so far is base + offs, and if that
	 * falls within the leaves we are done. Otherwise we adjust the range
	 * of offs and add one more bit to it.
	 */
	for (len = 1; ; ++len) {
		offs = 2 * offs + tinf_getbits(d, 1);

		assert(len <= 15);

		if (offs < t->counts[len]) {
			break;
		}

		base += t->counts[len];
		offs -= t->counts[len];
	}

	assert(base + offs >= 0 && base + offs < 288);

	return t->symbols[base + offs];
}